

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_Construct(CLzmaEnc *p)

{
  long in_RDI;
  CLzmaEncProps *unaff_retaddr;
  CLzmaEncProps props;
  CMatchFinder *in_stack_ffffffffffffffc0;
  
  RangeEnc_Construct((CRangeEnc *)(in_RDI + 0xb8));
  MatchFinder_Construct(in_stack_ffffffffffffffc0);
  LzmaEncProps_Init((CLzmaEncProps *)&stack0xffffffffffffffc0);
  LzmaEnc_SetProps((CLzmaEncHandle)props._0_8_,unaff_retaddr);
  LzmaEnc_FastPosInit((Byte *)(in_RDI + 0x30580));
  LzmaEnc_InitPriceTables((UInt32 *)(in_RDI + 0x32580));
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x3d348) = 0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc *p)
{
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
  
  #ifndef _7ZIP_ST
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
  #endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

  #ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
  #endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = NULL;
  p->saveState.litProbs = NULL;
}